

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

array<char,_22UL> * convertToPrintString(int64_t val)

{
  double *pdVar1;
  pointer pvVar2;
  size_type sVar3;
  long in_RSI;
  array<char,_22UL> *in_RDI;
  double l;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  in_RDI->_M_elems[0] = '\0';
  in_RDI->_M_elems[1] = '\0';
  in_RDI->_M_elems[2] = '\0';
  in_RDI->_M_elems[3] = '\0';
  in_RDI->_M_elems[4] = '\0';
  in_RDI->_M_elems[5] = '\0';
  in_RDI->_M_elems[6] = '\0';
  in_RDI->_M_elems[7] = '\0';
  in_RDI->_M_elems[8] = '\0';
  in_RDI->_M_elems[9] = '\0';
  in_RDI->_M_elems[10] = '\0';
  in_RDI->_M_elems[0xb] = '\0';
  in_RDI->_M_elems[0xc] = '\0';
  in_RDI->_M_elems[0xd] = '\0';
  in_RDI->_M_elems[0xe] = '\0';
  in_RDI->_M_elems[0xf] = '\0';
  in_RDI->_M_elems[0xe] = '\0';
  in_RDI->_M_elems[0xf] = '\0';
  in_RDI->_M_elems[0x10] = '\0';
  in_RDI->_M_elems[0x11] = '\0';
  in_RDI->_M_elems[0x12] = '\0';
  in_RDI->_M_elems[0x13] = '\0';
  in_RDI->_M_elems[0x14] = '\0';
  in_RDI->_M_elems[0x15] = '\0';
  local_18 = 1.0;
  local_20 = (double)in_RSI;
  local_8 = in_RSI;
  pdVar1 = std::max<double>(&local_18,&local_20);
  local_10 = log10(*pdVar1);
  if ((uint)(int)local_10 < 6) {
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a5d7);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%ld",local_8);
  }
  else if ((int)local_10 - 6U < 3) {
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a610);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%ldk",local_8 / 1000);
  }
  else {
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a653);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%ldm",local_8 / 1000000);
  }
  return in_RDI;
}

Assistant:

static std::array<char, 22> convertToPrintString(int64_t val) {
  decltype(convertToPrintString(std::declval<int64_t>())) printString = {};
  double l = std::log10(std::max(1.0, double(val)));
  switch (int(l)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      std::snprintf(printString.data(), printString.size(), "%" PRId64, val);
      break;
    case 6:
    case 7:
    case 8:
      std::snprintf(printString.data(), printString.size(), "%" PRId64 "k",
                    val / 1000);
      break;
    default:
      std::snprintf(printString.data(), printString.size(), "%" PRId64 "m",
                    val / 1000000);
  }

  return printString;
}